

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O1

void __thiscall polyscope::SurfaceMesh::computeVertexNormals(SurfaceMesh *this)

{
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *this_00;
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar4;
  uint uVar7;
  uint uVar8;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *pvVar9;
  pointer pvVar10;
  pointer pvVar11;
  float fVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ensureHostBufferPopulated
            (&this->faceNormals);
  render::ManagedBuffer<float>::ensureHostBufferPopulated(&this->faceAreas);
  pvVar9 = (this->vertexNormals).data;
  this_00 = &this->vertexPositions;
  sVar13 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size(this_00);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::resize(pvVar9,sVar13);
  pvVar9 = (this->vertexNormals).data;
  pvVar10 = (pvVar9->
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar11 = (pvVar9->
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar10 != pvVar11) {
    memset(pvVar10,0,((ulong)((long)pvVar11 + (-0xc - (long)pvVar10)) / 0xc) * 0xc + 0xc);
  }
  lVar16 = *(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x428;
  if (*(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x430 - lVar16 != 4) {
    uVar14 = 0;
    do {
      uVar7 = *(uint *)(lVar16 + uVar14 * 4);
      uVar15 = (ulong)uVar7;
      uVar8 = *(uint *)(lVar16 + 4 + uVar14 * 4);
      if (uVar8 != uVar7) {
        do {
          uVar7 = *(uint *)(*(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).
                                      field_0x440 + uVar15 * 4);
          pvVar10 = (((this->faceNormals).data)->
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          fVar17 = (((this->faceAreas).data)->super__Vector_base<float,_std::allocator<float>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar14];
          fVar1 = pvVar10[uVar14].field_2.z;
          pvVar11 = (((this->vertexNormals).data)->
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pvVar10 = pvVar10 + uVar14;
          uVar2 = pvVar10->field_0;
          uVar5 = pvVar10->field_1;
          uVar3 = pvVar11[uVar7].field_0;
          uVar6 = pvVar11[uVar7].field_1;
          auVar18._0_4_ = fVar17 * (float)uVar2 + (float)uVar3;
          auVar18._4_4_ = fVar17 * (float)uVar5 + (float)uVar6;
          auVar18._8_4_ = fVar17 * 0.0 + 0.0;
          auVar18._12_4_ = fVar17 * 0.0 + 0.0;
          uVar4 = vmovlps_avx(auVar18);
          pvVar11[uVar7].field_0 =
               (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar4;
          pvVar11[uVar7].field_1 =
               (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
               (int)((ulong)uVar4 >> 0x20);
          pvVar11[uVar7].field_2.z = fVar17 * fVar1 + pvVar11[uVar7].field_2.z;
          uVar15 = uVar15 + 1;
        } while (uVar8 != uVar15);
      }
      uVar14 = uVar14 + 1;
      lVar16 = *(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x428;
    } while (uVar14 < (*(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x430
                       - lVar16 >> 2) - 1U);
  }
  sVar13 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size(this_00);
  if (sVar13 != 0) {
    lVar16 = 0;
    uVar14 = 0;
    do {
      pvVar10 = (((this->vertexNormals).data)->
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      fVar17 = *(float *)((long)&pvVar10->field_0 + lVar16);
      uVar4 = *(undefined8 *)((long)&pvVar10->field_1 + lVar16);
      fVar1 = (float)uVar4;
      fVar12 = (float)((ulong)uVar4 >> 0x20);
      auVar19._0_4_ = fVar1 * fVar1;
      auVar19._4_4_ = fVar12 * fVar12;
      auVar19._8_8_ = 0;
      auVar18 = vmovshdup_avx(auVar19);
      fVar17 = fVar17 * fVar17 + auVar19._0_4_ + auVar18._0_4_;
      if (fVar17 < 0.0) {
        fVar17 = sqrtf(fVar17);
      }
      else {
        auVar18 = vsqrtss_avx(ZEXT416((uint)fVar17),ZEXT416((uint)fVar17));
        fVar17 = auVar18._0_4_;
      }
      fVar17 = 1.0 / fVar17;
      uVar4 = *(undefined8 *)((long)&pvVar10->field_0 + lVar16);
      auVar20._0_4_ = (float)uVar4 * fVar17;
      auVar20._4_4_ = (float)((ulong)uVar4 >> 0x20) * fVar17;
      auVar20._8_4_ = fVar17 * 0.0;
      auVar20._12_4_ = fVar17 * 0.0;
      fVar1 = *(float *)((long)&pvVar10->field_2 + lVar16);
      pvVar10 = (((this->vertexNormals).data)->
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar4 = vmovlps_avx(auVar20);
      *(undefined8 *)((long)&pvVar10->field_0 + lVar16) = uVar4;
      *(float *)((long)&pvVar10->field_2 + lVar16) = fVar17 * fVar1;
      uVar14 = uVar14 + 1;
      sVar13 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size(this_00);
      lVar16 = lVar16 + 0xc;
    } while (uVar14 < sVar13);
  }
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::markHostBufferUpdated
            (&this->vertexNormals);
  return;
}

Assistant:

void SurfaceMesh::computeVertexNormals() {

  faceNormals.ensureHostBufferPopulated();
  faceAreas.ensureHostBufferPopulated();

  vertexNormals.data.resize(nVertices());

  const glm::vec3 zero{0., 0., 0.};

  std::fill(vertexNormals.data.begin(), vertexNormals.data.end(), zero);

  // Accumulate quantities from each face
  for (size_t iF = 0; iF < nFaces(); iF++) {
    size_t start = faceIndsStart[iF];
    size_t D = faceIndsStart[iF + 1] - start;
    for (size_t j = 0; j < D; j++) {
      size_t iV = faceIndsEntries[start + j];
      vertexNormals.data[iV] += faceNormals.data[iF] * static_cast<float>(faceAreas.data[iF]);
    }
  }

  // Normalize
  for (size_t iV = 0; iV < nVertices(); iV++) {
    vertexNormals.data[iV] = glm::normalize(vertexNormals.data[iV]);
  }

  vertexNormals.markHostBufferUpdated();
}